

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_freeallobjects(lua_State *L)

{
  global_State *g;
  global_State *pgVar1;
  
  g = L->l_G;
  separatetobefnz(g,1);
  pgVar1 = L->l_G;
  while (pgVar1->tobefnz != (GCObject *)0x0) {
    GCTM(L,0);
  }
  g->currentwhite = '\x03';
  g->gckind = '\0';
  sweeplist(L,&g->finobj,0xffffffffffffffff);
  sweeplist(L,&g->allgc,0xffffffffffffffff);
  sweeplist(L,&g->fixedgc,0xffffffffffffffff);
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  lua_assert(g->tobefnz == NULL);
  g->currentwhite = WHITEBITS; /* this "white" makes all objects look dead */
  g->gckind = KGC_NORMAL;
  sweepwholelist(L, &g->finobj);
  sweepwholelist(L, &g->allgc);
  sweepwholelist(L, &g->fixedgc);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}